

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plt-elf.c
# Opt level: O0

Elf64_Sym * sym_lookup_dyn(plt_lib lib,char *name)

{
  Elf64_Sym *symtab_00;
  char *strtab_00;
  gnu_hash_header *gnuhash;
  Elf64_Word *hash_00;
  Elf64_Word *hash;
  gnu_hash_header *gnu_hash;
  char *strtab;
  Elf64_Sym *symtab;
  char *name_local;
  plt_lib lib_local;
  
  symtab_00 = (Elf64_Sym *)lib_dt_lookup(lib,6);
  strtab_00 = (char *)lib_dt_lookup(lib,5);
  if ((symtab_00 == (Elf64_Sym *)0x0) || (strtab_00 == (char *)0x0)) {
    lib_local = (plt_lib)0x0;
  }
  else {
    gnuhash = (gnu_hash_header *)lib_dt_lookup(lib,0x6ffffef5);
    if (gnuhash == (gnu_hash_header *)0x0) {
      hash_00 = (Elf64_Word *)lib_dt_lookup(lib,4);
      if (hash_00 == (Elf64_Word *)0x0) {
        lib_local = (plt_lib)0x0;
      }
      else {
        lib_local = (plt_lib)elf_hash_find(hash_00,symtab_00,strtab_00,name);
      }
    }
    else {
      lib_local = (plt_lib)gnu_hash_find(gnuhash,symtab_00,strtab_00,name);
    }
  }
  return (Elf64_Sym *)lib_local;
}

Assistant:

static ElfW(Sym) *sym_lookup_dyn(plt_lib lib, const char *name)
{
    ElfW(Sym) *symtab  = lib_dt_lookup(lib, DT_SYMTAB);
    const char *strtab = lib_dt_lookup(lib, DT_STRTAB);

    if (!symtab || !strtab)
        return NULL;

#ifdef DT_GNU_HASH
    // trust GNU hash if we have it.
    struct gnu_hash_header *gnu_hash = lib_dt_lookup(lib, DT_GNU_HASH);
    if (gnu_hash)
        return gnu_hash_find (gnu_hash, symtab, strtab, name);
#endif

    // Look up symbol table using traditional ELF hash.
    ElfW(Word) *hash = lib_dt_lookup(lib, DT_HASH);
    if (hash)
        return elf_hash_find (hash, symtab, strtab, name);

    // XXX: we could do a linear walk of the symbol table here...
    return NULL;

}